

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cpp
# Opt level: O3

void __thiscall miniros::Duration::Duration(Duration *this,Rate *rate)

{
  DurationBase<miniros::Duration> DVar1;
  int64_t nsec64;
  int64_t sec64;
  long local_28;
  long local_20;
  
  DVar1 = (rate->expected_cycle_time_).super_DurationBase<miniros::Duration>;
  this->super_DurationBase<miniros::Duration> = DVar1;
  local_20 = (long)DVar1.sec;
  local_28 = (long)DVar1 >> 0x20;
  normalizeSecNSecSigned(&local_20,&local_28);
  (this->super_DurationBase<miniros::Duration>).sec = (int32_t)local_20;
  (this->super_DurationBase<miniros::Duration>).nsec = (int32_t)local_28;
  return;
}

Assistant:

Duration::Duration(const Rate& rate)
    : DurationBase<Duration>(rate.expectedCycleTime().sec, rate.expectedCycleTime().nsec)
  { }